

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_av.c
# Opt level: O3

dtl_error_t dtl_av_sort(dtl_av_t *self,dtl_key_func_t *key,_Bool reverse)

{
  int iVar1;
  void **ppvVar2;
  dtl_sv_t *pdVar3;
  dtl_sv_t *other;
  bool bVar4;
  dtl_dv_type_id dVar5;
  dtl_dv_type_id dVar6;
  dtl_error_t dVar7;
  long lVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  _Bool local_3d;
  undefined4 local_3c;
  ulong local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000011,reverse);
  if (self == (dtl_av_t *)0x0) {
    dVar7 = 1;
  }
  else {
    dVar7 = 3;
    if (key == (dtl_key_func_t *)0x0) {
      iVar1 = self->pAny->s32CurLen;
      dVar7 = 0;
      if (1 < iVar1) {
        local_38 = (ulong)(iVar1 - 1);
        uVar11 = 1;
        uVar9 = 0;
        do {
          local_3d = false;
          ppvVar2 = self->pAny->pFirst;
          pdVar3 = (dtl_sv_t *)ppvVar2[uVar11 - 1];
          if ((pdVar3 == (dtl_sv_t *)0x0) ||
             (other = (dtl_sv_t *)ppvVar2[uVar11], other == (dtl_sv_t *)0x0)) {
            __assert_fail("(left != 0) && (right != 0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_type/src/dtl_av.c"
                          ,0xe6,"dtl_error_t dtl_av_insertion_sort(dtl_av_t *, _Bool)");
          }
          dVar5 = dtl_dv_type((dtl_dv_t *)pdVar3);
          dVar6 = dtl_dv_type((dtl_dv_t *)other);
          if (dVar5 != DTL_DV_SCALAR) {
            return 4;
          }
          if (dVar6 != DTL_DV_SCALAR) {
            return 4;
          }
          dVar7 = dtl_sv_lt(pdVar3,other,&local_3d);
          if (dVar7 != 0) {
            return dVar7;
          }
          if ((char)local_3c != '\0') {
            local_3d = (_Bool)(local_3d ^ 1);
          }
          if (local_3d == false) {
            self->pAny->pFirst[uVar11] = pdVar3;
            uVar10 = uVar9;
            if (uVar11 < 2) {
              lVar8 = 0;
            }
            else {
              do {
                pdVar3 = (dtl_sv_t *)self->pAny->pFirst[uVar10 - 1];
                dVar5 = dtl_dv_type((dtl_dv_t *)pdVar3);
                if (dVar5 != DTL_DV_SCALAR) {
                  return 4;
                }
                dVar7 = dtl_sv_lt(pdVar3,other,&local_3d);
                if (dVar7 != 0) {
                  return dVar7;
                }
                if ((char)local_3c != '\0') {
                  local_3d = (_Bool)(local_3d ^ 1);
                }
                if (local_3d != false) goto LAB_001039bc;
                self->pAny->pFirst[uVar10] = pdVar3;
                bVar4 = 1 < (long)uVar10;
                uVar10 = uVar10 - 1;
              } while (bVar4);
              uVar10 = 0;
LAB_001039bc:
              lVar8 = (long)(int)uVar10 << 3;
            }
            *(dtl_sv_t **)((long)self->pAny->pFirst + lVar8) = other;
          }
          uVar11 = uVar11 + 1;
          uVar9 = uVar9 + 1;
          dVar7 = 0;
        } while (uVar9 != local_38);
      }
    }
  }
  return dVar7;
}

Assistant:

dtl_error_t dtl_av_sort(dtl_av_t *self, dtl_key_func_t *key, bool reverse)
{
   if (self != 0)
   {
      if (key != 0)
      {
         return DTL_NOT_IMPLEMENTED_ERROR;
      }
      return dtl_av_insertion_sort(self, reverse);
   }
   return DTL_INVALID_ARGUMENT_ERROR;
}